

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

void __thiscall
ON_ClassId::ConstructorHelper(ON_ClassId *this,char *sClassName,char *sBaseClassName,char *sUUID)

{
  bool bVar1;
  int iVar2;
  ON_ClassId *pOVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  ON_ClassId **ppOVar7;
  undefined1 uVar8;
  uint uVar9;
  ON_ClassId *pOVar10;
  ON_UUID OVar11;
  undefined1 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffb9;
  undefined5 in_stack_ffffffffffffffba;
  uchar in_stack_ffffffffffffffbf;
  undefined8 local_40;
  undefined2 local_38;
  
  pcVar6 = this->m_sClassName;
  memset(pcVar6,0,0xa0);
  OVar11 = ON_UuidFromString(sUUID);
  this->m_uuid = OVar11;
  if (sClassName != (char *)0x0) {
    strncpy(pcVar6,sClassName,0x4f);
  }
  if (sBaseClassName != (char *)0x0) {
    strncpy(this->m_sBaseClassName,sBaseClassName,0x4f);
  }
  pOVar3 = ClassId(this->m_sBaseClassName);
  this->m_pBaseClassId = pOVar3;
  if (this->m_sClassName[0] == '\0') {
    pcVar6 = "ON_ClassId::ON_ClassId() - missing class name";
    iVar2 = 0x2e2;
  }
  else {
    pOVar3 = ClassId(pcVar6);
    if ((pOVar3 != (ON_ClassId *)0x0) && (2 < m_mark0)) {
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x2ee,"",
                   "ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique."
                  );
      uVar9 = 1;
      do {
        local_40 = 0x3736353433323130;
        local_38 = 0x3938;
        uVar4 = 6;
        uVar5 = uVar9;
        do {
          if ((int)uVar5 % 10 < 0) {
            uVar8 = 0x2d;
          }
          else {
            uVar8 = *(undefined1 *)((long)&local_40 + (ulong)(uint)((int)uVar5 % 10));
          }
          (&stack0xffffffffffffffb8)[uVar4] = uVar8;
          uVar4 = uVar4 - 1;
          uVar5 = (int)uVar5 / 10;
        } while (1 < uVar4);
        in_stack_ffffffffffffffb9 = '-';
        in_stack_ffffffffffffffbf = '\0';
        strncpy(pcVar6,sClassName,0x4f);
        strncat(pcVar6,&stack0xffffffffffffffb9,0x4f);
        pOVar3 = ClassId(pcVar6);
      } while ((uVar9 < 9999) && (uVar9 = uVar9 + 1, pOVar3 != (ON_ClassId *)0x0));
    }
    if (pOVar3 == (ON_ClassId *)0x0) {
      if (((*(long *)this->m_sClassName == 0x63656a624f5f4e4f && this->m_sClassName[8] == 't') &&
           this->m_sClassName[9] == '\0') || (this->m_sBaseClassName[0] != '\0')) {
        g_bDisableDemotion = 1;
        OVar11.Data4[0] = in_stack_ffffffffffffffb8;
        OVar11.Data1 = 0x552f8f;
        OVar11.Data2 = 0;
        OVar11.Data3 = 0;
        OVar11.Data4[1] = in_stack_ffffffffffffffb9;
        OVar11.Data4[2] = (char)in_stack_ffffffffffffffba;
        OVar11.Data4[3] = (char)((uint5)in_stack_ffffffffffffffba >> 8);
        OVar11.Data4[4] = (char)((uint5)in_stack_ffffffffffffffba >> 0x10);
        OVar11.Data4[5] = (char)((uint5)in_stack_ffffffffffffffba >> 0x18);
        OVar11.Data4[6] = (char)((uint5)in_stack_ffffffffffffffba >> 0x20);
        OVar11.Data4[7] = in_stack_ffffffffffffffbf;
        pOVar3 = ClassId(OVar11);
        g_bDisableDemotion = 0;
        if (pOVar3 == (ON_ClassId *)0x0) {
          bVar1 = ON_UuidIsNil(&this->m_uuid);
          pOVar3 = m_p0;
          if (!bVar1) {
            pOVar10 = m_p0;
            if (m_p0 != (ON_ClassId *)0x0 && *pcVar6 != '\0') {
              do {
                if ((((pOVar10->m_pBaseClassId == (ON_ClassId *)0x0) &&
                     (pOVar10->m_sBaseClassName[0] != '\0')) &&
                    (pOVar10->m_sBaseClassName[0x4f] == '\0')) &&
                   (iVar2 = strcmp(pcVar6,pOVar10->m_sBaseClassName), iVar2 == 0)) {
                  pOVar10->m_pBaseClassId = this;
                }
                ppOVar7 = &pOVar10->m_pNext;
                pOVar10 = *ppOVar7;
              } while (*ppOVar7 != (ON_ClassId *)0x0);
            }
            ppOVar7 = &m_p1->m_pNext;
            if (m_p1 == (ON_ClassId *)0x0) {
              ppOVar7 = &m_p0;
            }
            if (pOVar3 == (ON_ClassId *)0x0) {
              ppOVar7 = &m_p0;
            }
            ((ON_ClassId *)ppOVar7)->m_pNext = this;
            m_p1 = this;
            this->m_pNext = (ON_ClassId *)0x0;
            return;
          }
          pcVar6 = "ON_ClassId::ON_ClassId() - class uuid is nill.";
          iVar2 = 0x31b;
        }
        else {
          pcVar6 = "ON_ClassId::ON_ClassId() - class uuid already in use.";
          iVar2 = 0x315;
        }
      }
      else {
        pcVar6 = "ON_ClassId::ON_ClassId() - missing baseclass name.";
        iVar2 = 0x30c;
      }
    }
    else {
      pcVar6 = "ON_ClassId::ON_ClassId() - class name already in use.";
      iVar2 = 0x2fc;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
             ,iVar2,"",pcVar6);
  return;
}

Assistant:

void ON_ClassId::ConstructorHelper( const char* sClassName, 
                        const char* sBaseClassName, 
                        const char* sUUID // UUID in registry format from guidgen
                        ) 
{
  // Do not initialize "m_class_id_version" or any fields
  // after it in this helper.  See comments in the constructors
  // for more information.
  memset( m_sClassName, 0, sizeof(m_sClassName) );
  memset( m_sBaseClassName, 0, sizeof(m_sBaseClassName) );
  m_uuid = ON_UuidFromString(sUUID);
  if ( sClassName ) {
    strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
  }
  if ( sBaseClassName ) {
    strncpy( m_sBaseClassName, sBaseClassName, sizeof(m_sBaseClassName)-1 );
  }
  m_pBaseClassId = ClassId( m_sBaseClassName );

  if ( !m_sClassName[0] ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - missing class name");
    return;
  }

  const ON_ClassId* duplicate_class = ClassId( m_sClassName );
  // The m_mark0 > 2 test prevents opennurbs and Rhino from
  // having two ON_Object derived classes that have the same
  // name.  Plug-ins are free to use any name.
  if ( 0 != duplicate_class && m_mark0 > 2 )
  {
    char s[7];
    int ver;
    ON_WARNING("ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique.");
    for ( ver = 1; ver < 10000 && 0 != duplicate_class; ver++ )
    {
      IntToString(ver,s);
      s[6] = 0;
      strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
      strncat( m_sClassName, s, sizeof(m_sClassName)-1 );
      duplicate_class = ClassId( m_sClassName );
    }
  }

  if ( 0 != duplicate_class )
  {
    // Do NOT permit core classes to have duplicate names.
    ON_ERROR("ON_ClassId::ON_ClassId() - class name already in use.");
    return;
  }

  if (    m_sClassName[0] != 'O'
       || m_sClassName[1] != 'N'
       || m_sClassName[2] != '_'
       || m_sClassName[3] != 'O'
       || m_sClassName[4] != 'b'
       || m_sClassName[5] != 'j'
       || m_sClassName[6] != 'e'
       || m_sClassName[7] != 'c'
       || m_sClassName[8] != 't'
       || m_sClassName[9] != 0 ) {
    if ( !m_sBaseClassName[0] ) 
    {
      ON_ERROR("ON_ClassId::ON_ClassId() - missing baseclass name.");
      return;
    }
  }

  g_bDisableDemotion = true;
  if ( ClassId( m_uuid ) ) 
  {
    g_bDisableDemotion = false;
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid already in use.");
    return;
  }
  g_bDisableDemotion = false;

  if ( ON_UuidIsNil( m_uuid ) ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid is nill.");
    return;
  }

  // see if any derived classes need to be updated because their static
  // members got initialized first
  if ( m_sClassName[0] ) 
  {
    for ( ON_ClassId* p = m_p0; p; p = p->m_pNext )
    {
      if ( 
        0 == p->m_pBaseClassId 
        && 0 != p->m_sBaseClassName[0] 
        && 0 == p->m_sBaseClassName[sizeof(p->m_sBaseClassName)/sizeof(p->m_sBaseClassName[0]) - 1] 
        )
      {
        if ( 0 == strcmp( m_sClassName, p->m_sBaseClassName ) )
          p->m_pBaseClassId = this;
      }
    }
  }

  // Append to the list of class ids
  if ( m_p0 && m_p1 )
  {
    m_p1->m_pNext = this;
    m_p1 = this;
  }
  else
  {
    // first class id
    m_p0 = this;
  }
  m_p1 = this;
  m_p1->m_pNext = 0;
}